

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::assign2productShort<double,double>
          (SSVectorBase<double> *this,SVSetBase<double> *A,SSVectorBase<double> *x)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  Item *pIVar4;
  int *piVar5;
  pointer pdVar6;
  Nonzero<double> *pNVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  Real RVar15;
  double dVar16;
  
  uVar2 = (x->super_IdxSet).num;
  if ((ulong)uVar2 == 0) {
    clear(this);
    return this;
  }
  iVar11 = *(x->super_IdxSet).idx;
  dVar1 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar11];
  pIVar4 = (A->set).theitem;
  iVar11 = (A->set).thekey[iVar11].idx;
  (this->super_IdxSet).num = pIVar4[iVar11].data.super_SVectorBase<double>.memused;
  RVar15 = Tolerances::epsilon((this->_tolerances).
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  if ((ABS(dVar1) <= RVar15) || ((this->super_IdxSet).num == 0)) {
    clear(this);
  }
  else if (0 < (this->super_IdxSet).num) {
    piVar5 = (this->super_IdxSet).idx;
    pdVar6 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar8 = &(pIVar4[iVar11].data.super_SVectorBase<double>.m_elem)->idx;
    lVar10 = 0;
    uVar13 = 0;
    do {
      dVar16 = ((Nonzero<double> *)(piVar8 + -2))->val * dVar1;
      piVar5[uVar13] = *piVar8;
      pdVar6[*piVar8] = dVar16;
      uVar13 = (ulong)((int)uVar13 + (uint)(dVar16 != 0.0));
      lVar10 = lVar10 + 1;
      piVar8 = piVar8 + 4;
    } while (lVar10 < (this->super_IdxSet).num);
    goto LAB_001f967d;
  }
  uVar13 = 0;
LAB_001f967d:
  uVar12 = (uint)uVar13;
  if (1 < (int)uVar2) {
    uVar9 = 1;
    do {
      iVar11 = (x->super_IdxSet).idx[uVar9];
      dVar1 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar11];
      pIVar4 = (A->set).theitem;
      iVar11 = (A->set).thekey[iVar11].idx;
      uVar12 = pIVar4[iVar11].data.super_SVectorBase<double>.memused;
      RVar15 = Tolerances::epsilon((this->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if ((RVar15 < ABS(dVar1)) && (0 < (int)uVar12)) {
        pNVar7 = pIVar4[iVar11].data.super_SVectorBase<double>.m_elem;
        piVar5 = (this->super_IdxSet).idx;
        pdVar6 = (this->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar10 = 0;
        do {
          piVar5[(int)uVar13] = *(int *)((long)&pNVar7->idx + lVar10);
          iVar11 = *(int *)((long)&pNVar7->idx + lVar10);
          dVar16 = pdVar6[iVar11];
          uVar13 = (ulong)((int)uVar13 + (uint)(dVar16 == 0.0));
          dVar16 = *(double *)((long)&pNVar7->val + lVar10) * dVar1 + dVar16;
          uVar14 = -(ulong)(dVar16 == 0.0);
          pdVar6[iVar11] = (double)(uVar14 & 0x2b2bff2ee48e0530 | ~uVar14 & (ulong)dVar16);
          lVar10 = lVar10 + 0x10;
        } while ((ulong)uVar12 << 4 != lVar10);
      }
      uVar12 = (uint)uVar13;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2);
  }
  if (0 < (int)uVar12) {
    uVar13 = 0;
    iVar11 = 0;
    do {
      iVar3 = (this->super_IdxSet).idx[uVar13];
      dVar1 = (this->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar3];
      RVar15 = Tolerances::epsilon((this->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (ABS(dVar1) <= RVar15) {
        (this->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar3] = 0.0;
      }
      else {
        (this->super_IdxSet).idx[iVar11] = iVar3;
        iVar11 = iVar11 + 1;
      }
      (this->super_IdxSet).num = iVar11;
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  return this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productShort(const SVSetBase<S>& A,
      const SSVectorBase<T>& x)
{
   assert(x.isSetup());

   if(x.size() == 0)   // x can be setup but have size 0 => this := zero vector
   {
      clear();
      return *this;
   }

   // compute x[0] * A[0]
   int curidx = x.idx[0];
   const T x0 = x.val[curidx];
   const SVectorBase<S>& A0 = A[curidx];
   int nonzero_idx = 0;
   int xsize = x.size();
   int Aisize;

   num = A0.size();

   if(isZero(x0, this->tolerances()->epsilon()) || num == 0)
   {
      // A[0] == 0 or x[0] == 0 => this := zero vector
      clear();
   }
   else
   {
      for(int j = 0; j < num; ++j)
      {
         const Nonzero<S>& elt = A0.element(j);
         const R product = x0 * elt.val;

         // store the value in any case
         idx[nonzero_idx] = elt.idx;
         VectorBase<R>::val[elt.idx] = product;

         // count only non-zero values; not 'isNotZero(product, epsilon)'
         if(product != 0)
            ++nonzero_idx;
      }
   }

   // Compute the other x[i] * A[i] and add them to the existing vector.
   for(int i = 1; i < xsize; ++i)
   {
      curidx = x.idx[i];
      const T xi     = x.val[curidx];
      const SVectorBase<S>& Ai = A[curidx];

      // If A[i] == 0 or x[i] == 0, do nothing.
      Aisize = Ai.size();

      if(isNotZero(xi, this->tolerances()->epsilon()) || Aisize == 0)
      {
         // Compute x[i] * A[i] and add it to the existing vector.
         for(int j = 0; j < Aisize; ++j)
         {
            const Nonzero<S>& elt = Ai.element(j);
            idx[nonzero_idx] = elt.idx;
            R oldval  = VectorBase<R>::val[elt.idx];

            // An old value of exactly 0 means the position is still unused.
            // It will be used now (either by a new nonzero or by a SOPLEX_VECTOR_MARKER),
            // so increase the counter. If oldval != 0, we just
            // change an existing NZ-element, so don't increase the counter.
            if(oldval == 0)
               ++nonzero_idx;

            // Add the current product x[i] * A[i][j]; if oldval was
            // SOPLEX_VECTOR_MARKER before, it does not hurt because SOPLEX_VECTOR_MARKER is really small.
            oldval += xi * elt.val;

            // If the new value is exactly 0, mark the index as used
            // by setting a value which is nearly 0; otherwise, store
            // the value. Values below epsilon will be removed later.
            if(oldval == 0)
               VectorBase<R>::val[elt.idx] = SOPLEX_VECTOR_MARKER;
            else
               VectorBase<R>::val[elt.idx] = oldval;
         }
      }
   }

   // Clean up by shifting all nonzeros (w.r.t. epsilon) to the front of idx,
   // zeroing all values which are nearly 0, and setting #num# appropriately.
   int nz_counter = 0;

   for(int i = 0; i < nonzero_idx; ++i)
   {
      curidx = idx[i];

      if(isZero(VectorBase<R>::val[curidx], this->tolerances()->epsilon()))
         VectorBase<R>::val[curidx] = 0;
      else
      {
         idx[nz_counter] = curidx;
         ++nz_counter;
      }

      num = nz_counter;
   }

   assert(isConsistent());

   return *this;
}